

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

pair<int,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,int groupIndex)

{
  pointer this_00;
  pointer pLVar1;
  cmGeneratorTarget *pcVar2;
  size_type sVar3;
  EntryKind EVar4;
  bool bVar5;
  string *psVar6;
  cmValue cVar7;
  _Rb_tree_color _Var8;
  pointer pcVar9;
  ulong uVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar11;
  string_view str;
  string_view prefix;
  BFSEntry qe;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_b0;
  string var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  cmAlphaNum local_60;
  
  pVar11 = AllocateLinkEntry(this,item);
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var8 = pVar11.first._M_node._M_node[3]._M_color;
    uVar10 = 0;
    goto LAB_00454f1a;
  }
  _Var8 = pVar11.first._M_node._M_node[3]._M_color;
  pLVar1 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = pLVar1 + (int)_Var8;
  psVar6 = cmLinkItem::AsStr_abi_cxx11_(item);
  std::__cxx11::string::string((string *)&local_80,(string *)psVar6);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_b0,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)&item->Backtrace);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&qe,&local_80,(cmListFileBacktrace *)&local_b0);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
            (&this_00->Item,
             (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&qe);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
             )&qe);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  std::__cxx11::string::~string((string *)&local_80);
  pcVar2 = item->Target;
  pLVar1[(int)_Var8].Target = pcVar2;
  pcVar9 = pLVar1[(int)_Var8].Item.Value._M_dataplus._M_p;
  if (((pcVar2 == (cmGeneratorTarget *)0x0) && (*pcVar9 == '-')) && (pcVar9[1] != 'l')) {
    std::__cxx11::string::substr((ulong)&qe,(ulong)this_00);
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qe
                            ,"-framework");
    std::__cxx11::string::~string((string *)&qe);
    if (!bVar5) {
      pcVar9 = (this_00->Item).Value._M_dataplus._M_p;
      goto LAB_00454dfb;
    }
    EVar4 = Flag;
LAB_00454e2c:
    this_00->Kind = EVar4;
  }
  else {
LAB_00454dfb:
    str._M_str = pcVar9;
    str._M_len = (this_00->Item).Value._M_string_length;
    prefix._M_str = DAT_0086fc70;
    prefix._M_len = (anonymous_namespace)::LG_BEGIN;
    bVar5 = cmHasPrefix(str,prefix);
    if (((bVar5) && (sVar3 = (this_00->Item).Value._M_string_length, sVar3 != 0)) &&
       ((this_00->Item).Value._M_dataplus._M_p[sVar3 - 1] == '>')) {
      EVar4 = Group;
      goto LAB_00454e2c;
    }
  }
  uVar10 = 0x100000000;
  if (this_00->Kind != Group) {
    if (this_00->Target == (cmGeneratorTarget *)0x0) {
      qe.LibDepends = (this_00->Item).Value._M_dataplus._M_p;
      qe._0_8_ = (this_00->Item).Value._M_string_length;
      local_60.View_._M_len = 0xc;
      local_60.View_._M_str = "_LIB_DEPENDS";
      cmStrCat<>(&var,(cmAlphaNum *)&qe,&local_60);
      cVar7 = cmMakefile::GetDefinition(this->Makefile,&var);
      if (cVar7.Value == (string *)0x0) {
        if (this_00->Kind != Flag) {
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)_Var8].Initialized = true;
        }
      }
      else {
        qe.GroupIndex = groupIndex;
        qe.Index = _Var8;
        qe.LibDepends = ((cVar7.Value)->_M_dataplus)._M_p;
        std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ::push_back(&(this->BFSQueue).c,&qe);
      }
      std::__cxx11::string::~string((string *)&var);
    }
    else {
      qe.GroupIndex = groupIndex;
      qe.Index = _Var8;
      qe.LibDepends = (char *)0x0;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      push_back(&(this->BFSQueue).c,&qe);
    }
  }
LAB_00454f1a:
  return (pair<int,_bool>)(_Var8 | uVar10);
}

Assistant:

std::pair<int, bool> cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item,
                                                        int groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}